

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ProdItem * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol::ProdItem,slang::ast::RandSeqProductionSymbol::ProdItem>
          (BumpAllocator *this,ProdItem *args)

{
  RandSeqProductionSymbol *pRVar1;
  size_t sVar2;
  ProdBase PVar3;
  undefined4 uVar4;
  ProdItem *pPVar5;
  
  pPVar5 = (ProdItem *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProdItem *)this->endPtr < pPVar5 + 1) {
    pPVar5 = (ProdItem *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pPVar5 + 1);
  }
  PVar3.kind = (args->super_ProdBase).kind;
  uVar4 = *(undefined4 *)&args->field_0x4;
  pRVar1 = args->target;
  sVar2 = (args->args)._M_extent._M_extent_value;
  (pPVar5->args)._M_ptr = (args->args)._M_ptr;
  (pPVar5->args)._M_extent._M_extent_value = sVar2;
  pPVar5->super_ProdBase = (ProdBase)PVar3.kind;
  *(undefined4 *)&pPVar5->field_0x4 = uVar4;
  pPVar5->target = pRVar1;
  return pPVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }